

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strbuffer.c
# Opt level: O0

int strbuffer_init(strbuffer_t *strbuff)

{
  char *pcVar1;
  strbuffer_t *strbuff_local;
  
  strbuff->size = 0x10;
  strbuff->length = 0;
  pcVar1 = (char *)jsonp_malloc(strbuff->size);
  strbuff->value = pcVar1;
  if (strbuff->value == (char *)0x0) {
    strbuff_local._4_4_ = -1;
  }
  else {
    *strbuff->value = '\0';
    strbuff_local._4_4_ = 0;
  }
  return strbuff_local._4_4_;
}

Assistant:

int strbuffer_init(strbuffer_t *strbuff) {
    strbuff->size = STRBUFFER_MIN_SIZE;
    strbuff->length = 0;

    strbuff->value = jsonp_malloc(strbuff->size);
    if (!strbuff->value)
        return -1;

    /* initialize to empty */
    strbuff->value[0] = '\0';
    return 0;
}